

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::BlockChecked
          (PeerManagerImpl *this,CBlock *block,BlockValidationState *state)

{
  list<long,_std::allocator<long>_> *this_00;
  byte bVar1;
  ModeState MVar2;
  long lVar3;
  NodeId pnode;
  _List_node_base *pnode_00;
  _List_iterator<long> __x;
  _List_node_base *p_Var4;
  function<bool_(CNode_*)> func;
  bool bVar5;
  iterator __position;
  CNodeState *pCVar6;
  size_type sVar7;
  _List_iterator<long> _Var8;
  const_iterator __position_00;
  int iVar9;
  long in_FS_OFFSET;
  PeerRef peer;
  _List_node_base *local_90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  uint256 hash;
  PeerRef peer_ref;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock46,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x8e9,false);
  CBlockHeader::GetHash(&hash,&block->super_CBlockHeader);
  __position = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
               ::find(&(this->mapBlockSource)._M_t,&hash);
  MVar2 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  if (MVar2 == M_VALID) {
    bVar5 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
    if (!bVar5) {
      sVar7 = std::
              multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              ::count(&this->mapBlocksInFlight,&hash);
      if ((_Rb_tree_header *)__position._M_node !=
          &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header &&
          sVar7 == (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pnode_00 = *(_List_node_base **)(__position._M_node + 2);
        local_90 = pnode_00;
        if ((this->m_opts).ignore_incoming_txs == false) {
          pCVar6 = State(this,(NodeId)pnode_00);
          GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
          if ((pCVar6 != (CNodeState *)0x0) && (pCVar6->m_provides_cmpctblocks == true)) {
            this_00 = &this->lNodesAnnouncingHeaderAndIDs;
            iVar9 = 0;
            __position_00._M_node = (_List_node_base *)this_00;
            while (__position_00._M_node = (__position_00._M_node)->_M_next,
                  __position_00._M_node != (_List_node_base *)this_00) {
              if (__position_00._M_node[1]._M_next == pnode_00) {
                std::__cxx11::list<long,_std::allocator<long>_>::erase(this_00,__position_00);
                std::__cxx11::list<long,_std::allocator<long>_>::push_back
                          (this_00,(value_type_conflict3 *)&local_90);
                goto LAB_0019d274;
              }
              GetPeerRef((PeerManagerImpl *)&peer_ref,(NodeId)this);
              if (peer_ref.
                  super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                iVar9 = iVar9 + ((peer_ref.
                                  super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_is_inbound ^ 1);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&peer_ref.
                          super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            if ((((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != (element_type *)0x0) &&
                 ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_is_inbound == true)) &&
                (2 < (this->lNodesAnnouncingHeaderAndIDs).
                     super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size)) &&
               (iVar9 == 1)) {
              GetPeerRef((PeerManagerImpl *)&peer_ref,(NodeId)this);
              if ((peer_ref.
                   super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != (element_type *)0x0) &&
                 ((peer_ref.
                   super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_is_inbound == false)) {
                __x._M_node = (this_00->super__List_base<long,_std::allocator<long>_>)._M_impl.
                              _M_node.super__List_node_base._M_next;
                _Var8 = std::next<std::_List_iterator<long>>(__x,1);
                p_Var4 = __x._M_node[1]._M_next;
                __x._M_node[1]._M_next = _Var8._M_node[1]._M_next;
                _Var8._M_node[1]._M_next = p_Var4;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&peer_ref.
                          super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            peer_ref.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            func.super__Function_base._M_functor._8_8_ =
                 peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            func.super__Function_base._M_functor._M_unused._M_function_pointer =
                 (_func_void *)this_00;
            func.super__Function_base._M_manager =
                 (_Manager_type)
                 peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            func._M_invoker = (_Invoker_type)local_90;
            peer_ref.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)this;
            CConnman::ForNode(this->m_connman,(NodeId)pnode_00,func);
            std::_Function_base::~_Function_base((_Function_base *)&peer_ref);
          }
LAB_0019d274:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&peer.
                      super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
  }
  else if ((MVar2 == M_INVALID) &&
          ((_Rb_tree_header *)__position._M_node !=
           &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header)) {
    pnode = *(NodeId *)(__position._M_node + 2);
    pCVar6 = State(this,pnode);
    if (pCVar6 != (CNodeState *)0x0) {
      bVar1 = *(byte *)&__position._M_node[2]._M_parent;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&peer_ref,"",(allocator<char> *)&peer);
      MaybePunishNodeForBlock(this,pnode,state,(bool)(bVar1 ^ 1),(string *)&peer_ref);
      std::__cxx11::string::~string((string *)&peer_ref);
    }
  }
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
    ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                        *)&this->mapBlockSource,__position);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock46.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockChecked(const CBlock& block, const BlockValidationState& state)
{
    LOCK(cs_main);

    const uint256 hash(block.GetHash());
    std::map<uint256, std::pair<NodeId, bool>>::iterator it = mapBlockSource.find(hash);

    // If the block failed validation, we know where it came from and we're still connected
    // to that peer, maybe punish.
    if (state.IsInvalid() &&
        it != mapBlockSource.end() &&
        State(it->second.first)) {
            MaybePunishNodeForBlock(/*nodeid=*/ it->second.first, state, /*via_compact_block=*/ !it->second.second);
    }
    // Check that:
    // 1. The block is valid
    // 2. We're not in initial block download
    // 3. This is currently the best block we're aware of. We haven't updated
    //    the tip yet so we have no way to check this directly here. Instead we
    //    just check that there are currently no other blocks in flight.
    else if (state.IsValid() &&
             !m_chainman.IsInitialBlockDownload() &&
             mapBlocksInFlight.count(hash) == mapBlocksInFlight.size()) {
        if (it != mapBlockSource.end()) {
            MaybeSetPeerAsAnnouncingHeaderAndIDs(it->second.first);
        }
    }
    if (it != mapBlockSource.end())
        mapBlockSource.erase(it);
}